

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * vera::toString<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long *_value,int _precision)

{
  _Setprecision _Var1;
  ostream *poVar2;
  ostringstream local_198 [8];
  ostringstream out;
  int _precision_local;
  unsigned_long *_value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,std::fixed);
  _Var1 = std::setprecision(_precision);
  poVar2 = std::operator<<(poVar2,_Var1);
  std::ostream::operator<<(poVar2,*_value);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const T& _value, int _precision) {
    std::ostringstream out;
    out << std::fixed << std::setprecision(_precision) << _value;
    return out.str();
}